

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

string * serialization_pipeline<TreesIndexer>(string *__return_storage_ptr__,TreesIndexer *model)

{
  pointer pSVar1;
  size_t sVar2;
  SingleTreeIndex *node;
  pointer node_00;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range1;
  long lVar3;
  char *ptr;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar1 = (model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 8;
  for (node_00 = (model->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start; node_00 != pSVar1; node_00 = node_00 + 1) {
    sVar2 = get_size_node(node_00);
    lVar3 = lVar3 + sVar2;
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar3);
  local_38 = (__return_storage_ptr__->_M_dataplus)._M_p;
  serialization_pipeline<TreesIndexer,char*>(model,&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string serialization_pipeline(const Model &model)
{
    std::string serialized;
    serialized.resize(get_size_model(model));
    char *ptr = &serialized[0];
    serialization_pipeline(model, ptr);
    return serialized;
}